

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lys_parser_ext_instance_stmt(lysp_ctx *pctx,lysp_ext_substmt *substmt,lysp_stmt *stmt)

{
  ly_stmt lVar1;
  void **ppvVar2;
  void *pvVar3;
  byte bVar4;
  LY_ERR LVar5;
  void **ppvVar6;
  ly_ctx *plVar7;
  lysp_node *pnode;
  void *local_18;
  
  ppvVar2 = substmt->storage_p;
  if (ppvVar2 == (void **)0x0) {
    return LY_SUCCESS;
  }
  lVar1 = stmt->kw;
  if ((int)lVar1 < 0x130000) {
    if ((int)lVar1 < 0x20000) {
      if ((int)lVar1 < 0x100) {
        if (((lVar1 - LY_STMT_NOTIFICATION < 0x40) &&
            ((0x800000008000808bU >> ((ulong)(lVar1 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
           (lVar1 == LY_STMT_AUGMENT)) goto LAB_0016666a;
        goto LAB_00166a08;
      }
      if ((int)lVar1 < 0x1000) {
        if ((int)lVar1 < 0x400) {
          if ((lVar1 == LY_STMT_CASE) || (lVar1 == LY_STMT_CHOICE)) goto LAB_0016666a;
        }
        else if ((lVar1 == LY_STMT_CONTAINER) || (lVar1 == LY_STMT_GROUPING)) goto LAB_0016666a;
        goto LAB_00166a08;
      }
      if ((int)lVar1 < 0x4000) {
        if ((lVar1 != LY_STMT_LEAF) && (lVar1 != LY_STMT_LEAF_LIST)) goto LAB_00166a08;
LAB_0016666a:
        local_18 = (void *)0x0;
        LVar5 = lysp_stmt_parse(pctx,stmt,&local_18,(lysp_ext_instance **)(ulong)lVar1);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        ppvVar2 = substmt->storage_p;
        do {
          ppvVar6 = ppvVar2;
          pvVar3 = *ppvVar6;
          ppvVar2 = (void **)((long)pvVar3 + 0x10);
        } while (pvVar3 != (void *)0x0);
        *ppvVar6 = local_18;
        return LY_SUCCESS;
      }
      if ((lVar1 == LY_STMT_LIST) || (lVar1 == LY_STMT_USES)) goto LAB_0016666a;
      if (lVar1 != LY_STMT_ARGUMENT) goto LAB_00166a08;
    }
    else if ((int)lVar1 < 0xa0000) {
      if ((int)lVar1 < 0x60000) {
        if (0x3ffff < (int)lVar1) {
          if (lVar1 == LY_STMT_BIT) goto LAB_00166a2b;
          if (lVar1 != LY_STMT_CONFIG) goto LAB_00166a08;
          bVar4 = *(byte *)ppvVar2 & 3;
joined_r0x00166a29:
          if (bVar4 == 0) goto LAB_00166a2b;
          goto LAB_001669b6;
        }
        if (lVar1 == LY_STMT_BASE) goto LAB_00166a2b;
        if (lVar1 != LY_STMT_BELONGS_TO) goto LAB_00166a08;
      }
      else if ((int)lVar1 < 0x80000) {
        if (lVar1 != LY_STMT_CONTACT) {
          if (lVar1 == LY_STMT_DEFAULT) goto LAB_00166a2b;
          goto LAB_00166a08;
        }
      }
      else if (lVar1 != LY_STMT_DESCRIPTION) {
        if (lVar1 == LY_STMT_DEVIATE) goto LAB_00166a2b;
        goto LAB_00166a08;
      }
    }
    else if ((int)lVar1 < 0xe0000) {
      if ((int)lVar1 < 0xc0000) {
        if ((lVar1 == LY_STMT_DEVIATION) || (lVar1 == LY_STMT_ENUM)) goto LAB_00166a2b;
        goto LAB_00166a08;
      }
      if ((lVar1 != LY_STMT_ERROR_APP_TAG) && (lVar1 != LY_STMT_ERROR_MESSAGE)) goto LAB_00166a08;
    }
    else {
      if ((int)lVar1 < 0x100000) {
        if ((lVar1 != LY_STMT_EXTENSION) && (lVar1 != LY_STMT_EXTENSION_INSTANCE))
        goto LAB_00166a08;
        goto LAB_00166a2b;
      }
      if (lVar1 == LY_STMT_FEATURE) goto LAB_00166a2b;
      if (lVar1 != LY_STMT_FRACTION_DIGITS) {
        if (lVar1 != LY_STMT_IDENTITY) goto LAB_00166a08;
        goto LAB_00166a2b;
      }
    }
  }
  else if ((int)lVar1 < 0x240000) {
    if ((int)lVar1 < 0x1b0000) {
      if ((int)lVar1 < 0x170000) {
        if ((int)lVar1 < 0x150000) {
          if ((lVar1 != LY_STMT_IF_FEATURE) && (lVar1 != LY_STMT_IMPORT)) goto LAB_00166a08;
          goto LAB_00166a2b;
        }
        if (lVar1 == LY_STMT_INCLUDE) goto LAB_00166a2b;
        if (lVar1 != LY_STMT_KEY) goto LAB_00166a08;
      }
      else if ((int)lVar1 < 0x190000) {
        if ((lVar1 != LY_STMT_LENGTH) && (lVar1 != LY_STMT_MANDATORY)) goto LAB_00166a08;
      }
      else if ((lVar1 != LY_STMT_MAX_ELEMENTS) && (lVar1 != LY_STMT_MIN_ELEMENTS))
      goto LAB_00166a08;
    }
    else if ((int)lVar1 < 0x1f0000) {
      if ((int)lVar1 < 0x1d0000) {
        if ((lVar1 != LY_STMT_MODIFIER) && (lVar1 != LY_STMT_MODULE)) goto LAB_00166a08;
      }
      else {
        if (lVar1 == LY_STMT_MUST) goto LAB_00166a2b;
        if (lVar1 != LY_STMT_NAMESPACE) goto LAB_00166a08;
      }
    }
    else if ((int)lVar1 < 0x210000) {
      if (lVar1 == LY_STMT_ORDERED_BY) {
        bVar4 = *(byte *)ppvVar2 & 0xc0;
        goto joined_r0x00166a29;
      }
      if (lVar1 != LY_STMT_ORGANIZATION) goto LAB_00166a08;
    }
    else if (lVar1 != LY_STMT_PATH) {
      if (lVar1 == LY_STMT_PATTERN) goto LAB_00166a2b;
      if (lVar1 != LY_STMT_POSITION) goto LAB_00166a08;
    }
  }
  else if ((int)lVar1 < 0x2d0000) {
    if ((int)lVar1 < 0x280000) {
      if ((int)lVar1 < 0x260000) {
        if ((lVar1 != LY_STMT_PREFIX) && (lVar1 != LY_STMT_PRESENCE)) goto LAB_00166a08;
      }
      else if ((lVar1 != LY_STMT_RANGE) && (lVar1 != LY_STMT_REFERENCE)) goto LAB_00166a08;
    }
    else if ((int)lVar1 < 0x2a0000) {
      if (lVar1 == LY_STMT_REFINE) goto LAB_00166a2b;
      if (lVar1 != LY_STMT_REQUIRE_INSTANCE) goto LAB_00166a08;
    }
    else {
      if (lVar1 == LY_STMT_REVISION) goto LAB_00166a2b;
      if (lVar1 != LY_STMT_REVISION_DATE) {
        if (lVar1 != LY_STMT_STATUS) goto LAB_00166a08;
        bVar4 = *(byte *)ppvVar2 & 0x1c;
        goto joined_r0x00166a29;
      }
    }
  }
  else if ((int)lVar1 < 0x310000) {
    if (0x2effff < (int)lVar1) {
      if ((lVar1 == LY_STMT_TYPEDEF) || (lVar1 == LY_STMT_UNIQUE)) goto LAB_00166a2b;
LAB_00166a08:
      if (pctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
             ,0xea1);
      return LY_EINT;
    }
    if ((lVar1 != LY_STMT_SUBMODULE) && (lVar1 != LY_STMT_TYPE)) goto LAB_00166a08;
  }
  else if ((int)lVar1 < 0x330000) {
    if ((lVar1 != LY_STMT_UNITS) && (lVar1 != LY_STMT_VALUE)) goto LAB_00166a08;
  }
  else if ((lVar1 != LY_STMT_WHEN) &&
          ((lVar1 != LY_STMT_YANG_VERSION && (lVar1 != LY_STMT_YIN_ELEMENT)))) goto LAB_00166a08;
  if (*ppvVar2 == (void *)0x0) {
LAB_00166a2b:
    LVar5 = lysp_stmt_parse(pctx,stmt,ppvVar2,(lysp_ext_instance **)(ulong)lVar1);
    return LVar5;
  }
LAB_001669b6:
  if (pctx == (lysp_ctx *)0x0) {
    plVar7 = (ly_ctx *)0x0;
  }
  else {
    plVar7 = (ly_ctx *)
             **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",stmt->stmt);
  return LY_EVALID;
}

Assistant:

LY_ERR
lys_parser_ext_instance_stmt(struct lysp_ctx *pctx, struct lysp_ext_substmt *substmt, struct lysp_stmt *stmt)
{
    LY_ERR rc = LY_SUCCESS;

    if (!substmt->storage_p) {
        /* nothing to parse, ignored */
        goto cleanup;
    }

    switch (stmt->kw) {
    case LY_STMT_NOTIFICATION:
    case LY_STMT_INPUT:
    case LY_STMT_OUTPUT:
    case LY_STMT_ACTION:
    case LY_STMT_RPC:
    case LY_STMT_ANYDATA:
    case LY_STMT_ANYXML:
    case LY_STMT_AUGMENT:
    case LY_STMT_CASE:
    case LY_STMT_CHOICE:
    case LY_STMT_CONTAINER:
    case LY_STMT_GROUPING:
    case LY_STMT_LEAF:
    case LY_STMT_LEAF_LIST:
    case LY_STMT_LIST:
    case LY_STMT_USES: {
        struct lysp_node **pnodes_p, *pnode = NULL;

        /* parse the node */
        LY_CHECK_GOTO(rc = lysp_stmt_parse(pctx, stmt, (void **)&pnode, NULL), cleanup);

        /* usually is a linked-list of all the parsed schema nodes */
        pnodes_p = (struct lysp_node **)substmt->storage_p;
        while (*pnodes_p) {
            pnodes_p = &(*pnodes_p)->next;
        }
        *pnodes_p = pnode;

        break;
    }
    case LY_STMT_BASE:
    case LY_STMT_BIT:
    case LY_STMT_DEFAULT:
    case LY_STMT_DEVIATE:
    case LY_STMT_DEVIATION:
    case LY_STMT_ENUM:
    case LY_STMT_EXTENSION:
    case LY_STMT_EXTENSION_INSTANCE:
    case LY_STMT_FEATURE:
    case LY_STMT_IDENTITY:
    case LY_STMT_IF_FEATURE:
    case LY_STMT_IMPORT:
    case LY_STMT_INCLUDE:
    case LY_STMT_MUST:
    case LY_STMT_PATTERN:
    case LY_STMT_REFINE:
    case LY_STMT_REVISION:
    case LY_STMT_TYPEDEF:
    case LY_STMT_UNIQUE:
        /* parse, sized array */
        LY_CHECK_GOTO(rc = lysp_stmt_parse(pctx, stmt, substmt->storage_p, NULL), cleanup);
        break;

    case LY_STMT_ARGUMENT:
    case LY_STMT_BELONGS_TO:
    case LY_STMT_CONTACT:
    case LY_STMT_DESCRIPTION:
    case LY_STMT_ERROR_APP_TAG:
    case LY_STMT_ERROR_MESSAGE:
    case LY_STMT_FRACTION_DIGITS:
    case LY_STMT_KEY:
    case LY_STMT_LENGTH:
    case LY_STMT_MANDATORY:
    case LY_STMT_MAX_ELEMENTS:
    case LY_STMT_MIN_ELEMENTS:
    case LY_STMT_MODIFIER:
    case LY_STMT_MODULE:
    case LY_STMT_NAMESPACE:
    case LY_STMT_ORGANIZATION:
    case LY_STMT_PATH:
    case LY_STMT_POSITION:
    case LY_STMT_PREFIX:
    case LY_STMT_PRESENCE:
    case LY_STMT_RANGE:
    case LY_STMT_REFERENCE:
    case LY_STMT_REQUIRE_INSTANCE:
    case LY_STMT_REVISION_DATE:
    case LY_STMT_SUBMODULE:
    case LY_STMT_TYPE:
    case LY_STMT_UNITS:
    case LY_STMT_VALUE:
    case LY_STMT_WHEN:
    case LY_STMT_YANG_VERSION:
    case LY_STMT_YIN_ELEMENT:
        /* single item */
        if (*substmt->storage_p) {
            LOGVAL(PARSER_CTX(pctx), LY_VCODE_DUPSTMT, stmt->stmt);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* parse */
        LY_CHECK_GOTO(rc = lysp_stmt_parse(pctx, stmt, substmt->storage_p, NULL), cleanup);
        break;

    case LY_STMT_CONFIG:
        /* single item */
        if ((*(uint16_t *)substmt->storage_p) & LYS_CONFIG_MASK) {
            LOGVAL(PARSER_CTX(pctx), LY_VCODE_DUPSTMT, stmt->stmt);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* parse */
        LY_CHECK_GOTO(rc = lysp_stmt_parse(pctx, stmt, substmt->storage_p, NULL), cleanup);
        break;

    case LY_STMT_ORDERED_BY:
        /* single item */
        if ((*(uint16_t *)substmt->storage_p) & LYS_ORDBY_MASK) {
            LOGVAL(PARSER_CTX(pctx), LY_VCODE_DUPSTMT, stmt->stmt);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* parse */
        LY_CHECK_GOTO(rc = lysp_stmt_parse(pctx, stmt, substmt->storage_p, NULL), cleanup);
        break;

    case LY_STMT_STATUS:
        /* single item */
        if ((*(uint16_t *)substmt->storage_p) & LYS_STATUS_MASK) {
            LOGVAL(PARSER_CTX(pctx), LY_VCODE_DUPSTMT, stmt->stmt);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* parse */
        LY_CHECK_GOTO(rc = lysp_stmt_parse(pctx, stmt, substmt->storage_p, NULL), cleanup);
        break;

    default:
        LOGINT(PARSER_CTX(pctx));
        rc = LY_EINT;
        goto cleanup;
    }

cleanup:
    return rc;
}